

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,ListSchema schema,
          uint size)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ElementSize elementSize;
  Which elementType;
  uint uVar3;
  ushort uVar4;
  anon_union_8_2_eba6ea51_for_Type_5 aVar5;
  undefined8 uVar6;
  Type local_78;
  Schema local_68;
  Reader local_60;
  
  aVar5 = schema.elementType.field_4;
  uVar6 = schema.elementType._0_8_;
  local_78._0_8_ = uVar6;
  local_78.field_4.scopeId = aVar5.scopeId;
  if (schema.elementType.baseType == STRUCT &&
      ((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    local_68.raw = (RawBrandedSchema *)Type::asStruct(&local_78);
    Schema::getProto(&local_60,&local_68);
    uVar3 = 0;
    if (local_60._reader.dataSize < 0x80) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)
               ((long)&(((CapTableBuilder *)((long)local_60._reader.data + 8))->super_CapTableReader
                       )._vptr_CapTableReader + 6);
      if (0xcf < local_60._reader.dataSize) {
        uVar3 = (uint)*(ushort *)
                       &(((CapTableBuilder *)((long)local_60._reader.data + 0x18))->
                        super_CapTableReader)._vptr_CapTableReader << 0x10;
      }
    }
    _::OrphanBuilder::initStructList
              ((OrphanBuilder *)&local_60,pBVar1,pCVar2,size,(StructSize)(uVar4 | uVar3));
    (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar6;
    (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar6,2);
    (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar6,3);
    (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar6,4);
    *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar6,6);
    (__return_storage_ptr__->schema).elementType.field_4.scopeId = (uint64_t)aVar5;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_60._reader.capTable;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_60._reader.data;
    (__return_storage_ptr__->builder).location = (word *)local_60._reader.pointers;
  }
  else {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    elementType = LIST;
    if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0
       ) {
      elementType = schema.elementType.baseType;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    _::OrphanBuilder::initList((OrphanBuilder *)&local_60,pBVar1,pCVar2,size,elementSize);
    (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar6;
    (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar6,2);
    (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar6,3);
    (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar6,4);
    *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar6,6);
    (__return_storage_ptr__->schema).elementType.field_4.scopeId = (uint64_t)aVar5;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_60._reader.capTable;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_60._reader.data;
    (__return_storage_ptr__->builder).location = (word *)local_60._reader.pointers;
  }
  (__return_storage_ptr__->builder).tag.content = (uint64_t)local_60._reader.segment;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> Orphanage::newOrphan(ListSchema schema, uint size) const {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initStructList(
        arena, capTable, bounded(size) * ELEMENTS,
        structSizeFromSchema(schema.getStructElementType())));
  } else {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initList(
        arena, capTable, bounded(size) * ELEMENTS,
        elementSizeFor(schema.whichElementType())));
  }
}